

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  undefined8 uVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  undefined8 *in_RSI;
  long in_RDI;
  ImVec2 IVar4;
  ImVec2 size_min;
  ImGuiSizeCallbackData data;
  ImRect cr;
  ImVec2 new_size;
  ImGuiContext *g;
  ImGuiSizeCallbackData *in_stack_ffffffffffffffa0;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb8;
  float local_38;
  float fStack_34;
  float local_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  
  pIVar3 = GImGui;
  uVar1 = *in_RSI;
  if (((GImGui->NextWindowData).Flags & 0x10U) != 0) {
    IVar4 = (GImGui->NextWindowData).SizeConstraintRect.Min;
    IVar2 = (GImGui->NextWindowData).SizeConstraintRect.Max;
    local_38 = IVar4.x;
    if ((0.0 <= local_38) && (local_30 = IVar2.x, 0.0 <= local_30)) {
      local_28 = (float)uVar1;
      ImClamp<float>(local_28,local_38,local_30);
    }
    fStack_24 = (float)((ulong)uVar1 >> 0x20);
    fStack_34 = IVar4.y;
    if ((0.0 <= fStack_34) && (fStack_2c = IVar2.y, 0.0 <= fStack_2c)) {
      ImClamp<float>(fStack_24,fStack_34,fStack_2c);
    }
    if ((pIVar3->NextWindowData).SizeCallback != (ImGuiSizeCallback)0x0) {
      ImGuiSizeCallbackData::ImGuiSizeCallbackData(in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8 = (ImVec2 *)(pIVar3->NextWindowData).SizeCallbackUserData;
      in_stack_ffffffffffffffb8 = *(ImVec2 *)(in_RDI + 0x38);
      (*(pIVar3->NextWindowData).SizeCallback)((ImGuiSizeCallbackData *)&stack0xffffffffffffffa8);
    }
  }
  IVar4 = CalcWindowMinSize((ImGuiWindow *)in_stack_ffffffffffffffb8);
  IVar4 = ImMax(in_stack_ffffffffffffffa8,(ImVec2 *)IVar4);
  return IVar4;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // See comments in SetNextWindowSizeConstraints() for details about setting size_min an size_max.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_TRUNC(new_size.x);
        new_size.y = IM_TRUNC(new_size.y);
    }

    // Minimum size
    ImVec2 size_min = CalcWindowMinSize(window);
    return ImMax(new_size, size_min);
}